

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncSocket.h
# Opt level: O2

ssize_t __thiscall
uWS::AsyncSocket<false>::write(AsyncSocket<false> *this,int __fd,void *__buf,size_t __n)

{
  bool optionally;
  int iVar1;
  uint uVar2;
  uint uVar3;
  LoopData *pLVar4;
  string *this_00;
  pair<int,_bool> pVar5;
  uint length;
  undefined4 in_register_00000034;
  char *src;
  int in_R8D;
  ulong uVar6;
  ulong uStack_60;
  string local_50 [32];
  
  src = (char *)CONCAT44(in_register_00000034,__fd);
  optionally = SUB81(__n,0);
  pVar5 = (pair<int,_bool>)((ulong)__buf & 0xffffffff);
  iVar1 = us_socket_is_closed(0,this);
  uVar6 = 0;
  if (iVar1 != 0) goto LAB_00160650;
  pLVar4 = getLoopData(this);
  this_00 = (string *)getAsyncSocketData(this);
  length = (uint)__buf;
  if (*(long *)(this_00 + 8) != 0) {
    uVar2 = us_socket_write(0,this,*(undefined8 *)this_00,*(long *)(this_00 + 8),
                            (ulong)__buf & 0xffffffff);
    if ((ulong)uVar2 < *(ulong *)(this_00 + 8)) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
      std::__cxx11::string::operator=(this_00,local_50);
      std::__cxx11::string::~string(local_50);
      uStack_60 = 1;
      uVar6 = 1;
      if (optionally == false) {
        std::__cxx11::string::append((char *)this_00,(ulong)src);
      }
      else {
        pVar5.first = 0;
        pVar5.second = false;
        pVar5._5_3_ = 0;
        uVar6 = uStack_60;
      }
      goto LAB_00160650;
    }
    *(undefined8 *)(this_00 + 8) = 0;
    **(undefined1 **)this_00 = 0;
  }
  if (length == 0) {
    pVar5.first = 0;
    pVar5.second = false;
    pVar5._5_3_ = 0;
  }
  else {
    if ((AsyncSocket<false> *)pLVar4->corkedSocket != this) {
      uVar3 = us_socket_write(0,this,src,pVar5,in_R8D != 0);
      uVar2 = length;
      if ((int)uVar3 < (int)length) {
        uVar2 = uVar3;
      }
      if ((int)uVar3 < (int)length && optionally == false) {
        if (in_R8D != 0) {
          std::__cxx11::string::reserve((ulong)this_00);
        }
        std::__cxx11::string::append((char *)this_00,(ulong)(src + (int)uVar3));
        uVar6 = 1;
      }
      else {
        uVar6 = (ulong)((int)uVar3 < (int)length);
        pVar5._4_4_ = 0;
        pVar5.first = uVar2;
      }
      goto LAB_00160650;
    }
    if (0x4000 - pLVar4->corkOffset < (int)length) {
      pVar5 = uncork(this,src,length,optionally);
      uVar6 = (ulong)pVar5 >> 0x20;
      goto LAB_00160650;
    }
    memcpy(pLVar4->corkBuffer + pLVar4->corkOffset,src,(long)(int)length);
    pLVar4->corkOffset = pLVar4->corkOffset + length;
  }
  uVar6 = 0;
LAB_00160650:
  return (ulong)pVar5 & 0xffffffff | (uVar6 & 0xff) << 0x20;
}

Assistant:

std::pair<int, bool> write(const char *src, int length, bool optionally = false, int nextLength = 0) {
        /* Fake success if closed, simple fix to allow uncork of closed socket to succeed */
        if (us_socket_is_closed(SSL, (us_socket_t *) this)) {
            return {length, false};
        }

        LoopData *loopData = getLoopData();
        AsyncSocketData<SSL> *asyncSocketData = getAsyncSocketData();

        /* We are limited if we have a per-socket buffer */
        if (asyncSocketData->buffer.length()) {
            /* Write off as much as we can */
            int written = us_socket_write(SSL, (us_socket_t *) this, asyncSocketData->buffer.data(), (int) asyncSocketData->buffer.length(), /*nextLength != 0 | */length);

            /* On failure return, otherwise continue down the function */
            if ((unsigned int) written < asyncSocketData->buffer.length()) {

                /* Update buffering (todo: we can do better here if we keep track of what happens to this guy later on) */
                asyncSocketData->buffer = asyncSocketData->buffer.substr(written);

                if (optionally) {
                    /* Thankfully we can exit early here */
                    return {0, true};
                } else {
                    /* This path is horrible and points towards erroneous usage */
                    asyncSocketData->buffer.append(src, length);

                    return {length, true};
                }
            }

            /* At this point we simply have no buffer and can continue as normal */
            asyncSocketData->buffer.clear();
        }

        if (length) {
            if (loopData->corkedSocket == this) {
                /* We are corked */
                if (LoopData::CORK_BUFFER_SIZE - loopData->corkOffset >= length) {
                    /* If the entire chunk fits in cork buffer */
                    memcpy(loopData->corkBuffer + loopData->corkOffset, src, length);
                    loopData->corkOffset += length;
                    /* Fall through to default return */
                } else {
                    /* Strategy differences between SSL and non-SSL regarding syscall minimizing */
                    if constexpr (SSL) {
                        /* Cork up as much as we can */
                        int stripped = LoopData::CORK_BUFFER_SIZE - loopData->corkOffset;
                        memcpy(loopData->corkBuffer + loopData->corkOffset, src, stripped);
                        loopData->corkOffset = LoopData::CORK_BUFFER_SIZE;

                        auto [written, failed] = uncork(src + stripped, length - stripped, optionally);
                        return {written + stripped, failed};
                    }

                    /* For non-SSL we take the penalty of two syscalls */
                    return uncork(src, length, optionally);
                }
            } else {
                /* We are not corked */
                int written = us_socket_write(SSL, (us_socket_t *) this, src, length, nextLength != 0);

                /* Did we fail? */
                if (written < length) {
                    /* If the write was optional then just bail out */
                    if (optionally) {
                        return {written, true};
                    }

                    /* Fall back to worst possible case (should be very rare for HTTP) */
                    /* At least we can reserve room for next chunk if we know it up front */
                    if (nextLength) {
                        asyncSocketData->buffer.reserve(asyncSocketData->buffer.length() + length - written + nextLength);
                    }

                    /* Buffer this chunk */
                    asyncSocketData->buffer.append(src + written, length - written);

                    /* Return the failure */
                    return {length, true};
                }
                /* Fall through to default return */
            }
        }

        /* Default fall through return */
        return {length, false};
    }